

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  unsigned_long uVar4;
  char *pcVar5;
  bool local_11a;
  undefined1 local_f0 [8];
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  uint local_7c;
  uint i;
  Directory d;
  string local_60 [8];
  string finishPath;
  string startPath;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *path_local;
  
  lVar2 = std::__cxx11::string::find((char *)path,0xa23a5c);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&finishPath.field_2 + 8),(ulong)path);
    std::__cxx11::string::substr((ulong)local_60,(ulong)path);
    cmsys::Directory::Directory((Directory *)&stack0xffffffffffffff88);
    bVar1 = cmsys::Directory::Load
                      ((Directory *)&stack0xffffffffffffff88,
                       (string *)((long)&finishPath.field_2 + 8));
    if (bVar1) {
      for (local_7c = 0; uVar3 = (ulong)local_7c,
          uVar4 = cmsys::Directory::GetNumberOfFiles((Directory *)&stack0xffffffffffffff88),
          uVar3 < uVar4; local_7c = local_7c + 1) {
        fname.field_2._M_local_buf[0xe] = '\0';
        fname.field_2._M_local_buf[0xd] = '\0';
        pcVar5 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff88,(ulong)local_7c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a0,pcVar5,&local_a1);
        bVar1 = std::operator!=(&local_a0,".");
        local_11a = false;
        if (bVar1) {
          pcVar5 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff88,(ulong)local_7c);
          std::allocator<char>::allocator();
          fname.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string
                    ((string *)&local_c8,pcVar5,(allocator *)(fname.field_2._M_local_buf + 0xf));
          fname.field_2._M_local_buf[0xd] = '\x01';
          local_11a = std::operator!=(&local_c8,"..");
        }
        if ((fname.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_c8);
        }
        if ((fname.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
        }
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        if (local_11a != false) {
          std::__cxx11::string::string
                    ((string *)local_f0,(string *)(finishPath.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)local_f0,"/");
          pcVar5 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff88,(ulong)local_7c);
          std::__cxx11::string::operator+=((string *)local_f0,pcVar5);
          bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_f0);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)local_f0,local_60);
            GlobDirs((string *)local_f0,files);
          }
          std::__cxx11::string::~string((string *)local_f0);
        }
      }
    }
    cmsys::Directory::~Directory((Directory *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)(finishPath.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = startPath;
        fname += "/";
        fname += d.GetFile(i);
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}